

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  FilePath *this;
  bool bVar1;
  char *path;
  ostream *poVar2;
  GTestLog local_68 [4];
  undefined1 local_58 [8];
  FilePath output_dir;
  FilePath output_file_path;
  FILE *fileout;
  string *output_file_local;
  
  output_file_path.pathname_.field_2._8_8_ = 0;
  this = (FilePath *)((long)&output_dir.pathname_.field_2 + 8);
  FilePath::FilePath(this,output_file);
  FilePath::RemoveFileName((FilePath *)local_58,this);
  bVar1 = FilePath::CreateDirectoriesRecursively((FilePath *)local_58);
  if (bVar1) {
    path = (char *)std::__cxx11::string::c_str();
    output_file_path.pathname_.field_2._8_8_ = posix::FOpen(path,"w");
  }
  if (output_file_path.pathname_.field_2._8_8_ == 0) {
    GTestLog::GTestLog(local_68,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/build_O0/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0xcf);
    poVar2 = GTestLog::GetStream(local_68);
    poVar2 = std::operator<<(poVar2,"Unable to open file \"");
    poVar2 = std::operator<<(poVar2,(string *)output_file);
    std::operator<<(poVar2,"\"");
    GTestLog::~GTestLog(local_68);
  }
  FilePath::~FilePath((FilePath *)local_58);
  FilePath::~FilePath((FilePath *)((long)&output_dir.pathname_.field_2 + 8));
  return (FILE *)output_file_path.pathname_.field_2._8_8_;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = NULL;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == NULL) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}